

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client.cpp
# Opt level: O3

int __thiscall miniros::ServiceClient::Impl::shutdown(Impl *this,int __fd,int __how)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int extraout_EAX;
  element_type *in_RAX;
  element_type *extraout_RAX;
  
  if (this->is_shutdown_ == false) {
    if (this->persistent_ == false) {
      this->is_shutdown_ = true;
    }
    in_RAX = (this->server_link_).
             super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (in_RAX != (element_type *)0x0) {
      Connection::drop((in_RAX->connection_).
                       super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       Destructing);
      this_00 = (this->server_link_).
                super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (this->server_link_).
      super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (this->server_link_).
      super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      in_RAX = extraout_RAX;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        return extraout_EAX;
      }
    }
  }
  return (int)in_RAX;
}

Assistant:

void ServiceClient::Impl::shutdown()
{
  if (!is_shutdown_)
  {
    if (!persistent_)
    {
      is_shutdown_ = true;
    }

    if (server_link_)
    {
      server_link_->getConnection()->drop(Connection::Destructing);
      server_link_.reset();
    }
  }
}